

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O2

void __thiscall ImplSimd<SimdSSE2>::AlphaBlend(ImplSimd<SimdSSE2> *this,RGB *rgb,uint8_t alpha)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar7 = rgb->size_;
  if ((uVar7 & 7) == 0) {
    puVar3 = rgb->r_;
    puVar4 = rgb->g_;
    puVar5 = rgb->b_;
    auVar8[1] = 0;
    auVar8[0] = alpha;
    auVar8[2] = alpha;
    auVar8[3] = 0;
    auVar8[4] = alpha;
    auVar8[5] = 0;
    auVar8[6] = alpha;
    auVar8[7] = 0;
    auVar8[8] = alpha;
    auVar8[9] = 0;
    auVar8[10] = alpha;
    auVar8[0xb] = 0;
    auVar8[0xc] = alpha;
    auVar8[0xd] = 0;
    auVar8[0xe] = alpha;
    auVar8[0xf] = 0;
    for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 8) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(puVar3 + uVar6);
      auVar9 = vpmovzxbw_avx(auVar9);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(puVar4 + uVar6);
      auVar1 = vpmovzxbw_avx(auVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(puVar5 + uVar6);
      auVar2 = vpmovzxbw_avx(auVar2);
      auVar9 = vpmullw_avx(auVar8,auVar9);
      auVar9 = vpsraw_avx(auVar9,8);
      auVar9 = vpacksswb_avx(auVar9,auVar9);
      *(long *)(puVar3 + uVar6) = auVar9._0_8_;
      auVar9 = vpmullw_avx(auVar8,auVar1);
      auVar9 = vpsraw_avx(auVar9,8);
      auVar9 = vpacksswb_avx(auVar9,auVar9);
      *(long *)(puVar4 + uVar6) = auVar9._0_8_;
      auVar9 = vpmullw_avx(auVar8,auVar2);
      auVar9 = vpsraw_avx(auVar9,8);
      auVar9 = vpacksswb_avx(auVar9,auVar9);
      *(long *)(puVar5 + uVar6) = auVar9._0_8_;
      uVar7 = rgb->size_;
    }
    return;
  }
  __assert_fail("rgb->size_ % kStride == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x5b,
                "virtual void ImplSimd<SimdSSE2>::AlphaBlend(RGB *, uint8_t) [SIMD = SimdSSE2]");
}

Assistant:

void ImplSimd<SIMD>::AlphaBlend(RGB *rgb, uint8_t alpha) {
  assert(rgb->size_ % kStride == 0);

  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  Vector const_alpha = cn(alpha);

  for(size_t i = 0; i < rgb->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);
    /*
    r[i] = (uint32_t)alpha * r[i] >> 8;
    g[i] = (uint32_t)alpha * g[i] >> 8;
    b[i] = (uint32_t)alpha * b[i] >> 8;
     */
    store(rli(mul(const_alpha, c),8),r+i);
    store(rli(mul(const_alpha, d),8),g+i);
    store(rli(mul(const_alpha, e),8),b+i);
    SIMD::Empty();
  }
}